

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwt_merger.hpp
# Opt level: O0

void next_leaves(dna_bwt_t *bwt1,dna_bwt_t *bwt2,sa_leaf *L1,sa_leaf *L2,
                vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
                *TMP_LEAVES,int *t,int min_size)

{
  int iVar1;
  range_t r;
  range_t r_00;
  range_t rn;
  range_t rn_00;
  range_t r_01;
  range_t r_02;
  range_t r_03;
  range_t r_04;
  range_t r_05;
  range_t r_06;
  uint64_t uVar2;
  uint64_t uVar3;
  __normal_iterator<std::pair<sa_leaf,_sa_leaf>_*,_std::vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>_>
  *this;
  pair<sa_leaf,_sa_leaf> *this_00;
  iterator iVar4;
  __normal_iterator<std::pair<sa_leaf,_sa_leaf>_*,_std::vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>_>
  _Var5;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_> *in_R8;
  int *in_R9;
  int in_stack_00000008;
  p_range ext_2;
  p_range ext_1;
  type in_stack_fffffffffffffce8;
  pair<sa_leaf,_sa_leaf> *in_stack_fffffffffffffcf0;
  sa_leaf local_2d0;
  sa_leaf local_2b8;
  pair<sa_leaf,_sa_leaf> local_2a0;
  unsigned_long local_270;
  unsigned_long local_268;
  unsigned_long local_260;
  unsigned_long local_258;
  unsigned_long local_250;
  unsigned_long local_248;
  dna_bwt<dna_string> *in_stack_fffffffffffffdc0;
  unsigned_long in_stack_fffffffffffffdc8;
  unsigned_long in_stack_fffffffffffffdd0;
  pair<sa_leaf,_sa_leaf> local_220;
  unsigned_long local_1f0;
  unsigned_long local_1e8;
  unsigned_long local_1e0;
  unsigned_long local_1d8;
  sa_leaf local_1d0;
  sa_leaf local_1b8;
  pair<sa_leaf,_sa_leaf> local_1a0;
  unsigned_long local_170;
  unsigned_long local_168;
  unsigned_long local_160;
  unsigned_long local_158;
  sa_leaf local_150;
  sa_leaf local_138;
  pair<sa_leaf,_sa_leaf> local_120;
  unsigned_long local_f0;
  unsigned_long local_e8;
  unsigned_long local_e0;
  unsigned_long local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  unsigned_long local_c0;
  unsigned_long local_b8;
  unsigned_long local_b0;
  unsigned_long local_a8;
  unsigned_long local_a0;
  unsigned_long local_98;
  unsigned_long local_90;
  unsigned_long local_88;
  undefined8 local_80;
  undefined8 local_78;
  unsigned_long local_70;
  unsigned_long local_68;
  unsigned_long local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  unsigned_long local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  int *local_30;
  vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_> *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  
  local_80 = *in_RDX;
  local_78 = in_RDX[1];
  rn.second = in_stack_fffffffffffffdd0;
  rn.first = in_stack_fffffffffffffdc8;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  dna_bwt<dna_string>::LF(in_stack_fffffffffffffdc0,rn);
  local_d0 = *local_20;
  local_c8 = local_20[1];
  rn_00.second = in_stack_fffffffffffffdd0;
  rn_00.first = in_stack_fffffffffffffdc8;
  dna_bwt<dna_string>::LF(in_stack_fffffffffffffdc0,rn_00);
  *local_30 = 0;
  local_e0 = local_70;
  local_d8 = local_68;
  r_06.second = local_68;
  r_06.first = local_70;
  uVar2 = range_length(r_06);
  local_f0 = local_c0;
  local_e8 = local_b8;
  r_05.second = local_b8;
  r_05.first = local_c0;
  uVar3 = range_length(r_05);
  if ((ulong)(long)in_stack_00000008 <= uVar2 + uVar3) {
    local_138.rn.first = local_70;
    local_138.rn.second = local_68;
    local_138.depth = local_18[2] + 1;
    local_150.rn.first = local_c0;
    local_150.rn.second = local_b8;
    local_150.depth = local_20[2] + 1;
    std::pair<sa_leaf,_sa_leaf>::pair<sa_leaf,_sa_leaf,_true>(&local_120,&local_138,&local_150);
    iVar1 = *local_30;
    *local_30 = iVar1 + 1;
    std::vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>::
    operator[](local_28,(long)iVar1);
    std::pair<sa_leaf,_sa_leaf>::operator=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  }
  local_160 = local_60;
  local_158 = local_58;
  r_04.second = local_58;
  r_04.first = local_60;
  uVar2 = range_length(r_04);
  local_170 = local_b0;
  local_168 = local_a8;
  r_03.second = local_a8;
  r_03.first = local_b0;
  uVar3 = range_length(r_03);
  if ((ulong)(long)in_stack_00000008 <= uVar2 + uVar3) {
    local_1b8.rn.first = local_60;
    local_1b8.rn.second = local_58;
    local_1b8.depth = local_18[2] + 1;
    local_1d0.rn.first = local_b0;
    local_1d0.rn.second = local_a8;
    local_1d0.depth = local_20[2] + 1;
    std::pair<sa_leaf,_sa_leaf>::pair<sa_leaf,_sa_leaf,_true>(&local_1a0,&local_1b8,&local_1d0);
    iVar1 = *local_30;
    *local_30 = iVar1 + 1;
    std::vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>::
    operator[](local_28,(long)iVar1);
    std::pair<sa_leaf,_sa_leaf>::operator=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  }
  local_1e0 = local_50;
  local_1d8 = local_48;
  r_02.second = local_48;
  r_02.first = local_50;
  this = (__normal_iterator<std::pair<sa_leaf,_sa_leaf>_*,_std::vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>_>
          *)range_length(r_02);
  local_1f0 = local_a0;
  local_1e8 = local_98;
  r_01.second = local_98;
  r_01.first = local_a0;
  uVar2 = range_length(r_01);
  if ((ulong)(long)in_stack_00000008 <= (long)&this->_M_current + uVar2) {
    local_250 = local_a0;
    local_248 = local_98;
    std::pair<sa_leaf,_sa_leaf>::pair<sa_leaf,_sa_leaf,_true>
              (&local_220,(sa_leaf *)&stack0xfffffffffffffdc8,(sa_leaf *)&local_250);
    iVar1 = *local_30;
    *local_30 = iVar1 + 1;
    std::vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>::
    operator[](local_28,(long)iVar1);
    std::pair<sa_leaf,_sa_leaf>::operator=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  }
  local_260 = local_40;
  local_258 = local_38;
  r_00.second = local_38;
  r_00.first = local_40;
  this_00 = (pair<sa_leaf,_sa_leaf> *)range_length(r_00);
  local_270 = local_90;
  local_268 = local_88;
  r.second = local_88;
  r.first = local_90;
  uVar2 = range_length(r);
  if ((ulong)(long)in_stack_00000008 <= (long)&(this_00->first).rn.first + uVar2) {
    local_2b8.rn.first = local_40;
    local_2b8.rn.second = local_38;
    local_2b8.depth = local_18[2] + 1;
    local_2d0.rn.first = local_90;
    local_2d0.rn.second = local_88;
    local_2d0.depth = local_20[2] + 1;
    std::pair<sa_leaf,_sa_leaf>::pair<sa_leaf,_sa_leaf,_true>(&local_2a0,&local_2b8,&local_2d0);
    iVar1 = *local_30;
    *local_30 = iVar1 + 1;
    std::vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>::
    operator[](local_28,(long)iVar1);
    std::pair<sa_leaf,_sa_leaf>::operator=(this_00,in_stack_fffffffffffffce8);
  }
  iVar4 = std::vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>::
          begin((vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
                 *)in_stack_fffffffffffffce8);
  std::vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>::begin
            ((vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_> *)
             in_stack_fffffffffffffce8);
  _Var5 = __gnu_cxx::
          __normal_iterator<std::pair<sa_leaf,_sa_leaf>_*,_std::vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>_>
          ::operator+(this,this_00);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<sa_leaf,sa_leaf>*,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>>,next_leaves(dna_bwt<dna_string>*,dna_bwt<dna_string>*,sa_leaf&,sa_leaf&,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>&,int&,int)::__0>
            (iVar4._M_current,_Var5._M_current);
  return;
}

Assistant:

void next_leaves(dna_bwt_t * bwt1, dna_bwt_t * bwt2, sa_leaf & L1, sa_leaf & L2, vector<pair<sa_leaf, sa_leaf> > & TMP_LEAVES, int & t, int min_size){

	p_range ext_1 = bwt1->LF(L1.rn);
	p_range ext_2 = bwt2->LF(L2.rn);

	//push non-empty leaves on stack in decreasing size order

	t = 0;

	if(range_length(ext_1.A) + range_length(ext_2.A) >= min_size) TMP_LEAVES[t++] = {{ext_1.A, L1.depth+1},{ext_2.A, L2.depth+1}};
	if(range_length(ext_1.C) + range_length(ext_2.C) >= min_size) TMP_LEAVES[t++] = {{ext_1.C, L1.depth+1},{ext_2.C, L2.depth+1}};
	if(range_length(ext_1.G) + range_length(ext_2.G) >= min_size) TMP_LEAVES[t++] = {{ext_1.G, L1.depth+1},{ext_2.G, L2.depth+1}};
	if(range_length(ext_1.T) + range_length(ext_2.T) >= min_size) TMP_LEAVES[t++] = {{ext_1.T, L1.depth+1},{ext_2.T, L2.depth+1}};

	std::sort( TMP_LEAVES.begin(), TMP_LEAVES.begin()+t, [ ]( const pair<sa_leaf, sa_leaf>& lhs, const pair<sa_leaf, sa_leaf>& rhs )
	{
		return leaf_size(lhs) < leaf_size(rhs);
	});

}